

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

int ar_estimate(double *x,int N,int method)

{
  int iVar1;
  double *x_00;
  ulong uVar2;
  uint uVar3;
  int p;
  bool bVar4;
  double dVar5;
  double local_88;
  double loglik;
  double wmean;
  ulong local_70;
  double local_68;
  double *local_60;
  double *local_58;
  double local_50;
  double var;
  double local_40;
  uint local_34;
  
  local_34 = N;
  x_00 = (double *)malloc((long)N * 8);
  local_60 = (double *)malloc((long)N * 8);
  wmean = (double)N;
  dVar5 = log(wmean);
  local_70 = (ulong)(N - 1U);
  iVar1 = imin(N - 1U,(int)(dVar5 * 10.0));
  if (method == 2) {
    iVar1 = imin(iVar1,0xc);
  }
  uVar3 = local_34;
  loglik = mean(x,local_34);
  local_40 = loglik;
  local_58 = (double *)malloc((long)(iVar1 + 1) * (long)(iVar1 + 1) * 8);
  var = (double)malloc((long)iVar1 << 3);
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      x_00[uVar2] = x[uVar2] - local_40;
      uVar2 = uVar2 + 1;
    } while (local_34 != uVar2);
  }
  if (0 < iVar1) {
    local_68 = 0.0;
    uVar3 = 2;
    p = 1;
    do {
      if (method == 1) {
        burgalg(x_00,(int)local_70,p,(double *)var,&local_50);
      }
      else if (method == 0) {
        ywalg2(x_00,local_34,p,(double *)var,&local_50);
      }
      else if (method == 2) {
        as154(x_00,local_34,7,p,0,0,(double *)var,(double *)0x0,&loglik,&local_50,local_60,&local_88
              ,local_58,0);
      }
      else {
        puts("\n The code only accepts numerical values 0,1 and 2 ");
        puts("\n Method 0 : Yule-Walker ");
        puts("\n Method 1 : Burg ");
        puts("\n Method 2 : MLE ");
      }
      dVar5 = log(local_50);
      if (p == 1) {
        local_40 = (double)CONCAT44(local_40._4_4_,1);
      }
      else {
        dVar5 = (double)uVar3 / wmean + dVar5;
        if (dVar5 < local_68) {
          local_40 = (double)CONCAT44(local_40._4_4_,p);
          local_68 = dVar5;
        }
      }
      uVar3 = uVar3 + 2;
      bVar4 = p != iVar1;
      p = p + 1;
    } while (bVar4);
  }
  puts("\n");
  iVar1 = local_40._0_4_;
  printf("AIC Estimate : p = %d \n",(ulong)local_40 & 0xffffffff);
  free(x_00);
  free(local_60);
  free(local_58);
  free((void *)var);
  return iVar1;
}

Assistant:

int ar_estimate(double *x, int N, int method) {
	int p, ordermax, logn, i;
	double wmean, aic, loglik, var, lvar, aic0,cssml;
	double *inp, *resid, *hess, *phi;

	inp = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	logn = (int) (10.0 * log((double)N));
	ordermax = imin(N - 1, logn);

	if (method == 2) {
		ordermax = imin(ordermax, 12); // MLE
	}
	wmean = mean(x, N);
	aic0 = 0.0;
	cssml = 0;

	hess = (double*)malloc(sizeof(double)* (ordermax + 1) * (ordermax + 1));
	phi = (double*)malloc(sizeof(double)* ordermax);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	for (i = 0; i < ordermax; ++i) {
		if (method == 0) {
			ywalg2(inp, N, i + 1, phi, &var);
		}
		else if (method == 1) {
			burgalg(inp, N-1, i + 1, phi, &var);
		}
		else if (method == 2) {
			as154(inp, N, 7, i + 1, 0, 0, phi, NULL, &wmean, &var, resid, &loglik, hess,cssml);
		}
		else {
			printf("\n The code only accepts numerical values 0,1 and 2 \n");
			printf("\n Method 0 : Yule-Walker \n");
			printf("\n Method 1 : Burg \n");
			printf("\n Method 2 : MLE \n");
		}
		lvar = log(var);
		aic = lvar + 2 * (double)(i + 1) / N;
		if (i == 0) {
			aic = aic0;
			p = 1;
		}
		else {
			if (aic < aic0) {
				aic0 = aic;
				p = i + 1;
			}
		}
	}

	printf("\n\n");
	printf("AIC Estimate : p = %d \n", p);

	free(inp);
	free(resid);
	free(hess);
	free(phi);
	return p;
}